

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_HTMLparser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing HTMLparser : 32 of 38 functions ...\n");
  }
  iVar1 = test_UTF8ToHtml();
  iVar2 = test_htmlAttrAllowed();
  iVar3 = test_htmlAutoCloseTag();
  iVar4 = test_htmlCreateMemoryParserCtxt();
  iVar5 = test_htmlCreatePushParserCtxt();
  iVar6 = test_htmlCtxtReadDoc();
  iVar7 = test_htmlCtxtReadFile();
  iVar8 = test_htmlCtxtReadMemory();
  iVar9 = test_htmlCtxtReset();
  iVar10 = test_htmlCtxtUseOptions();
  iVar11 = test_htmlElementAllowedHere();
  iVar12 = test_htmlElementStatusHere();
  iVar13 = test_htmlEncodeEntities();
  iVar14 = test_htmlEntityLookup();
  iVar15 = test_htmlEntityValueLookup();
  iVar16 = test_htmlHandleOmittedElem();
  iVar17 = test_htmlIsAutoClosed();
  iVar18 = test_htmlIsScriptAttribute();
  iVar19 = test_htmlNewParserCtxt();
  iVar20 = test_htmlNodeStatus();
  iVar21 = test_htmlParseCharRef();
  iVar22 = test_htmlParseChunk();
  iVar23 = test_htmlParseDoc();
  iVar24 = test_htmlParseDocument();
  iVar25 = test_htmlParseElement();
  iVar26 = test_htmlParseEntityRef();
  iVar27 = test_htmlParseFile();
  iVar28 = test_htmlReadDoc();
  iVar29 = test_htmlReadFile();
  iVar30 = test_htmlReadMemory();
  iVar31 = test_htmlSAXParseDoc();
  iVar32 = test_htmlSAXParseFile();
  iVar33 = test_htmlTagLookup();
  uVar34 = iVar33 + iVar32 + iVar31 + iVar30 + iVar29 + iVar28 + iVar27 + iVar26 + iVar25 + iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar34 != 0) {
    printf("Module HTMLparser: %d errors\n",(ulong)uVar34);
  }
  return uVar34;
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 32 of 38 functions ...\n");
    test_ret += test_UTF8ToHtml();
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}